

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DTDScanner.cpp
# Opt level: O0

void __thiscall xercesc_4_0::DTDScanner::scanTextDecl(DTDScanner *this)

{
  DocTypeHandler *pDVar1;
  XMLScanner *pXVar2;
  bool bVar3;
  bool bVar4;
  XMLVersion XVar5;
  XMLBuffer *pXVar6;
  XMLCh *pXVar7;
  XMLCh *pXVar8;
  XMLReader *this_00;
  undefined1 local_40 [7];
  bool gotEncoding;
  XMLBufBid bbEncoding;
  undefined1 local_20 [8];
  XMLBufBid bbVersion;
  DTDScanner *this_local;
  
  bbVersion.fMgr = (XMLBufferMgr *)this;
  ReaderMgr::skipPastSpaces(this->fReaderMgr);
  XMLBufBid::XMLBufBid((XMLBufBid *)local_20,this->fBufMgr);
  bVar3 = ReaderMgr::skippedString(this->fReaderMgr,(XMLCh *)XMLUni::fgVersionString);
  if (bVar3) {
    bVar3 = scanEq(this);
    if (!bVar3) {
      XMLScanner::emitError(this->fScanner,ExpectedEqSign);
      ReaderMgr::skipPastChar(this->fReaderMgr,L'>');
      bbEncoding.fMgr._0_4_ = 1;
      goto LAB_003f2a2e;
    }
    pXVar6 = XMLBufBid::getBuffer((XMLBufBid *)local_20);
    bVar3 = getQuotedString(this,pXVar6);
    if (!bVar3) {
      XMLScanner::emitError(this->fScanner,BadXMLVersion);
      ReaderMgr::skipPastChar(this->fReaderMgr,L'>');
      bbEncoding.fMgr._0_4_ = 1;
      goto LAB_003f2a2e;
    }
    pXVar7 = XMLBufBid::getRawBuffer((XMLBufBid *)local_20);
    bVar3 = XMLString::equals(pXVar7,L"1.1");
    if (bVar3) {
      XVar5 = XMLScanner::getXMLVersion(this->fScanner);
      if (XVar5 != XMLV1_1) {
        pXVar2 = this->fScanner;
        pXVar7 = XMLBufBid::getRawBuffer((XMLBufBid *)local_20);
        XMLScanner::emitError
                  (pXVar2,UnsupportedXMLVersion,pXVar7,(XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0);
      }
    }
    else {
      pXVar7 = XMLBufBid::getRawBuffer((XMLBufBid *)local_20);
      bVar3 = XMLString::equals(pXVar7,L"1.0");
      if (!bVar3) {
        pXVar2 = this->fScanner;
        pXVar7 = XMLBufBid::getRawBuffer((XMLBufBid *)local_20);
        XMLScanner::emitError
                  (pXVar2,UnsupportedXMLVersion,pXVar7,(XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0);
      }
    }
  }
  XMLBufBid::XMLBufBid((XMLBufBid *)local_40,this->fBufMgr);
  ReaderMgr::skipPastSpaces(this->fReaderMgr);
  bVar3 = false;
  bVar4 = ReaderMgr::skippedString(this->fReaderMgr,(XMLCh *)XMLUni::fgEncodingString);
  if (bVar4) {
    bVar3 = scanEq(this);
    if (bVar3) {
      pXVar6 = XMLBufBid::getBuffer((XMLBufBid *)local_40);
      getQuotedString(this,pXVar6);
      bVar3 = XMLBufBid::isEmpty((XMLBufBid *)local_40);
      if (!bVar3) {
        pXVar7 = XMLBufBid::getRawBuffer((XMLBufBid *)local_40);
        bVar3 = XMLString::isValidEncName(pXVar7);
        if (bVar3) {
          bVar3 = true;
          goto LAB_003f2816;
        }
      }
      pXVar2 = this->fScanner;
      pXVar7 = XMLBufBid::getRawBuffer((XMLBufBid *)local_40);
      XMLScanner::emitError(pXVar2,BadXMLEncoding,pXVar7,(XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0);
      ReaderMgr::skipPastChar(this->fReaderMgr,L'>');
      bbEncoding.fMgr._0_4_ = 1;
    }
    else {
      XMLScanner::emitError(this->fScanner,ExpectedEqSign);
      ReaderMgr::skipPastChar(this->fReaderMgr,L'>');
      bbEncoding.fMgr._0_4_ = 1;
    }
  }
  else {
LAB_003f2816:
    if (bVar3) {
      ReaderMgr::skipPastSpaces(this->fReaderMgr);
      bVar3 = ReaderMgr::skippedChar(this->fReaderMgr,L'?');
      if (bVar3) {
        bVar3 = ReaderMgr::skippedChar(this->fReaderMgr,L'>');
        if (!bVar3) {
          XMLScanner::emitError(this->fScanner,UnterminatedXMLDecl);
          ReaderMgr::skipPastChar(this->fReaderMgr,L'>');
        }
      }
      else {
        XMLScanner::emitError(this->fScanner,UnterminatedXMLDecl);
        ReaderMgr::skipPastChar(this->fReaderMgr,L'>');
      }
      if (this->fDocTypeHandler != (DocTypeHandler *)0x0) {
        pDVar1 = this->fDocTypeHandler;
        pXVar7 = XMLBufBid::getRawBuffer((XMLBufBid *)local_20);
        pXVar8 = XMLBufBid::getRawBuffer((XMLBufBid *)local_40);
        (*pDVar1->_vptr_DocTypeHandler[0x11])(pDVar1,pXVar7,pXVar8);
      }
      bVar3 = XMLBufBid::isEmpty((XMLBufBid *)local_40);
      if (!bVar3) {
        this_00 = ReaderMgr::getCurrentReader(this->fReaderMgr);
        pXVar7 = XMLBufBid::getRawBuffer((XMLBufBid *)local_40);
        bVar3 = XMLReader::setEncoding(this_00,pXVar7);
        if (!bVar3) {
          pXVar2 = this->fScanner;
          pXVar7 = XMLBufBid::getRawBuffer((XMLBufBid *)local_40);
          XMLScanner::emitError
                    (pXVar2,ContradictoryEncoding,pXVar7,(XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0);
        }
      }
      bbEncoding.fMgr._0_4_ = 0;
    }
    else {
      XMLScanner::emitError(this->fScanner,EncodingRequired);
      ReaderMgr::skipPastChar(this->fReaderMgr,L'>');
      bbEncoding.fMgr._0_4_ = 1;
    }
  }
  XMLBufBid::~XMLBufBid((XMLBufBid *)local_40);
LAB_003f2a2e:
  XMLBufBid::~XMLBufBid((XMLBufBid *)local_20);
  return;
}

Assistant:

void DTDScanner::scanTextDecl()
{
    // Skip any subsequent whitespace before the version string
    fReaderMgr->skipPastSpaces();

    // Next should be the version string
    XMLBufBid bbVersion(fBufMgr);
    if (fReaderMgr->skippedString(XMLUni::fgVersionString))
    {
        if (!scanEq())
        {
            fScanner->emitError(XMLErrs::ExpectedEqSign);
            fReaderMgr->skipPastChar(chCloseAngle);
            return;
        }

        //
        //  Followed by a single or double quoted version. Get a buffer for
        //  the string.
        //
        if (!getQuotedString(bbVersion.getBuffer()))
        {
            fScanner->emitError(XMLErrs::BadXMLVersion);
            fReaderMgr->skipPastChar(chCloseAngle);
            return;
        }

        // If its not our supported version, issue an error but continue
        if (XMLString::equals(bbVersion.getRawBuffer(), XMLUni::fgVersion1_1)) {
            if (fScanner->getXMLVersion() != XMLReader::XMLV1_1)
        	    fScanner->emitError(XMLErrs::UnsupportedXMLVersion, bbVersion.getRawBuffer());
        }
        else if (!XMLString::equals(bbVersion.getRawBuffer(), XMLUni::fgVersion1_0))
            fScanner->emitError(XMLErrs::UnsupportedXMLVersion, bbVersion.getRawBuffer());
    }

    // Ok, now we must have an encoding string
    XMLBufBid bbEncoding(fBufMgr);
    fReaderMgr->skipPastSpaces();
    bool gotEncoding = false;
    if (fReaderMgr->skippedString(XMLUni::fgEncodingString))
    {
        // There must be a equal sign next
        if (!scanEq())
        {
            fScanner->emitError(XMLErrs::ExpectedEqSign);
            fReaderMgr->skipPastChar(chCloseAngle);
            return;
        }

        // Followed by a single or double quoted version string
        getQuotedString(bbEncoding.getBuffer());
        if (bbEncoding.isEmpty() || !XMLString::isValidEncName(bbEncoding.getRawBuffer()))
        {
            fScanner->emitError(XMLErrs::BadXMLEncoding, bbEncoding.getRawBuffer());
            fReaderMgr->skipPastChar(chCloseAngle);
            return;
        }

        // Indicate that we got an encoding
        gotEncoding = true;
    }

    //
    // Encoding declarations are required in the external entity
    // if there is a text declaration present
    //
    if (!gotEncoding)
    {
      fScanner->emitError(XMLErrs::EncodingRequired);
      fReaderMgr->skipPastChar(chCloseAngle);
      return;

    }

    fReaderMgr->skipPastSpaces();
    if (!fReaderMgr->skippedChar(chQuestion))
    {
        fScanner->emitError(XMLErrs::UnterminatedXMLDecl);
        fReaderMgr->skipPastChar(chCloseAngle);
    }
     else if (!fReaderMgr->skippedChar(chCloseAngle))
    {
        fScanner->emitError(XMLErrs::UnterminatedXMLDecl);
        fReaderMgr->skipPastChar(chCloseAngle);
    }

    //
    //  If we have a document type handler and advanced callbacks are on,
    //  then call the TextDecl callback
    //
    if (fDocTypeHandler)
    {
        fDocTypeHandler->TextDecl
        (
            bbVersion.getRawBuffer()
            , bbEncoding.getRawBuffer()
        );
    }

    //
    //  If we got an encoding string, then we have to call back on the reader
    //  to tell it what the encoding is.
    //
    if (!bbEncoding.isEmpty())
    {
        if (!fReaderMgr->getCurrentReader()->setEncoding(bbEncoding.getRawBuffer()))
            fScanner->emitError(XMLErrs::ContradictoryEncoding, bbEncoding.getRawBuffer());
    }
}